

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_p1363_test.cc
# Opt level: O0

void __thiscall
ECDSAP1363Test_SignFailsWithSmallBuffer_Test::~ECDSAP1363Test_SignFailsWithSmallBuffer_Test
          (ECDSAP1363Test_SignFailsWithSmallBuffer_Test *this)

{
  ECDSAP1363Test_SignFailsWithSmallBuffer_Test *this_local;
  
  ~ECDSAP1363Test_SignFailsWithSmallBuffer_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ECDSAP1363Test, SignFailsWithSmallBuffer) {
  // Fill digest values with some random data.
  uint8_t digest[20];
  ASSERT_TRUE(RAND_bytes(digest, sizeof(digest)));

  bssl::UniquePtr<EC_KEY> key(EC_KEY_new());
  ASSERT_TRUE(key);
  ASSERT_TRUE(EC_KEY_set_group(key.get(), EC_group_p256()));
  ASSERT_TRUE(EC_KEY_generate_key(key.get()));

  size_t sig_len = ECDSA_size_p1363(key.get());
  ASSERT_GT(sig_len, 0u);
  std::vector<uint8_t> sig(sig_len - 1);

  size_t out_sig_len;
  ASSERT_FALSE(ECDSA_sign_p1363(digest, sizeof(digest), sig.data(),
                                &out_sig_len, sig.size(), key.get()));
}